

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O0

Value __thiscall xmrig::CudaConfig::toJSON(CudaConfig *this,Document *doc)

{
  bool bVar1;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  long in_RSI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  Value VVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *obj;
  undefined4 in_stack_ffffffffffffff48;
  Type in_stack_ffffffffffffff4c;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  StringRefType *in_stack_ffffffffffffffa8;
  Threads<xmrig::CudaThreads> *in_stack_ffffffffffffffb0;
  
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GetAllocator(in_RDX);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_RDI,in_stack_ffffffffffffff4c);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                  (bool)in_stack_ffffffffffffffa7,
                  (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff98);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  String::toJSON((String *)in_stack_ffffffffffffff68);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
            (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff98);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)&stack0xffffffffffffff98);
  bVar1 = String::isNull((String *)(in_RSI + 0x70));
  uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff4c);
  if (bVar1) {
    rapidjson::StringRef<char>((char *)CONCAT44(uVar3,in_stack_ffffffffffffff48));
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                    (bool)in_stack_ffffffffffffffa7,
                    (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff98);
  }
  else {
    rapidjson::StringRef<char>((char *)CONCAT44(uVar3,in_stack_ffffffffffffff48));
    String::toJSON((String *)in_stack_ffffffffffffff68);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
              (MemoryPoolAllocator<rapidjson::CrtAllocator> *)in_stack_ffffffffffffff98);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&stack0xffffffffffffff68);
  }
  Threads<xmrig::CudaThreads>::toJSON
            (in_stack_ffffffffffffffb0,(Value *)in_stack_ffffffffffffffa8,
             (Document *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  VVar2.data_.s.str = (Ch *)extraout_RDX;
  VVar2.data_.n = (Number)in_RDI;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::CudaConfig::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value obj(kObjectType);

    obj.AddMember(StringRef(kEnabled),  m_enabled, allocator);
    obj.AddMember(StringRef(kLoader),   m_loader.toJSON(), allocator);

#   ifdef XMRIG_FEATURE_NVML
    if (m_nvmlLoader.isNull()) {
        obj.AddMember(StringRef(kNvml), m_nvml, allocator);
    }
    else {
        obj.AddMember(StringRef(kNvml), m_nvmlLoader.toJSON(), allocator);
    }
#   endif

    m_threads.toJSON(obj, doc);

    return obj;
}